

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
* packing::overloadAndRemove
            (tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
             *__return_storage_ptr__,
            vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  int iVar1;
  optional<packing::ProtoPalAttrs> *poVar2;
  pointer poVar3;
  unsigned_long uVar4;
  uint uVar5;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_01;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_02;
  undefined1 auVar6 [16];
  _Bit_iterator_base _Var7;
  FILE *pFVar8;
  pointer pAVar9;
  pointer puVar10;
  pointer __first1;
  _Bit_iterator_base _Var11;
  bool bVar12;
  bool bVar13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __position;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  *pIVar17;
  vector<bool,_std::allocator<bool>_> *pvVar18;
  reference prVar19;
  const_iterator pvVar20;
  const_iterator pvVar21;
  size_type sVar22;
  ulong *puVar23;
  _Node_iterator<unsigned_short,_true,_false> _Var24;
  unsigned_long uVar25;
  undefined1 *puVar26;
  AssignedProtos *pal;
  pointer pAVar27;
  AssignedProtos *pAVar28;
  long lVar29;
  pointer puVar30;
  iterator __begin2;
  long lVar31;
  _Elt_pointer pPVar32;
  value_type_conflict2 *colorIndex_1;
  ProtoPalAttrs *attrs;
  AssignedProtos *__range3_2;
  ProtoPalette *pPVar33;
  size_t i;
  ulong uVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  _Bit_iterator_base __it2;
  _Bit_iterator _Var38;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_01;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_02;
  remove_const_t<decltype(_assigned)> *local_1c8;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> members;
  vector<bool,_std::allocator<bool>_> processed;
  size_t local_148;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  local_138;
  iterator attrs_1;
  DefaultInitVec<size_t> mappings;
  _Elt_pointer apPStack_e8 [5];
  anon_class_8_1_7660daf7 efficiency;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  local_b8;
  pointer local_b0;
  DefaultInitVec<size_t> sortedProtoPalIDs;
  _Node_iterator<unsigned_short,_true,_false> local_88;
  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
  queue;
  
  Options::verbosePrint
            (&options,'\x02',"Paginating palettes using \"overload-and-remove\" strategy...\n");
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector(&sortedProtoPalIDs,
           (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&queue);
  if (sortedProtoPalIDs.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      sortedProtoPalIDs.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sortedProtoPalIDs.
    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         sortedProtoPalIDs.
         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  for (queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
       _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
      _M_impl.super__Deque_impl_data._M_map <
      (_Map_pointer)
      ((long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3);
      queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
      _M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((long)queue.c.
                  super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>
                  ._M_impl.super__Deque_impl_data._M_map + 1)) {
    __position = std::
                 __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (sortedProtoPalIDs.
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            sortedProtoPalIDs.
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&queue);
    std::
    vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>::
    insert(&sortedProtoPalIDs,(const_iterator)__position._M_current,(value_type_conflict3 *)&queue);
  }
  std::deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>>::
  deque<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>,void>
            ((deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>> *)&mappings,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )sortedProtoPalIDs.
               super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )sortedProtoPalIDs.
               super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&processed);
  std::_Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::_Deque_base
            ((_Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&queue,
             (_Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)
             &mappings);
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque
            ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&mappings);
  local_1b8.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_start = (AssignedProtos *)0x0;
  local_1b8.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_finish = (AssignedProtos *)0x0;
  local_1b8.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001067c9:
  pPVar32 = queue.c.
            super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pAVar9 = local_1b8.
           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur !=
      queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    Options::verbosePrint
              (&options,'\x04',"Handling proto-pal %zu\n",
               (queue.c.
                super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur)->protoPalIndex);
    pAVar27 = local_1b8.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pAVar9 = local_1b8.
             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar33 = (protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
              _M_impl.super__Vector_impl_data._M_start + pPVar32->protoPalIndex;
    sVar14 = ProtoPalette::size(pPVar33);
    auVar37._8_4_ = (int)(sVar14 >> 0x20);
    auVar37._0_8_ = sVar14;
    auVar37._12_4_ = 0x45300000;
    uVar15 = 0;
    uVar34 = (long)pAVar27 - (long)pAVar9 >> 5;
LAB_0010685e:
    local_148 = uVar34;
    lVar31 = uVar15 << 5;
    uVar34 = uVar15;
    do {
      uVar15 = (long)local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar15 <= uVar34) {
        if (local_148 != uVar15) {
          pAVar28 = local_1b8.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_148;
          AssignedProtos::assign<packing::ProtoPalAttrs_const>(pAVar28,pPVar32);
          goto LAB_00106973;
        }
        std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
        emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                  ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                   &local_1b8,protoPalettes,pPVar32);
        goto LAB_00106942;
      }
      bVar12 = ProtoPalAttrs::isBannedFrom(pPVar32,uVar34);
      pAVar27 = local_1b8.
                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar9 = local_1b8.
               super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar12) {
        dVar35 = AssignedProtos::relSizeOf
                           ((AssignedProtos *)
                            ((long)&((local_1b8.
                                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar31),pPVar33);
        sVar16 = ProtoPalette::size(pPVar33);
        uVar15 = uVar34 + 1;
        Options::verbosePrint
                  (&options,'\x04',"%zu/%zu: Rel size: %f (size = %zu)\n",dVar35,uVar15,
                   (long)pAVar27 - (long)pAVar9 >> 5,sVar16);
        dVar35 = AssignedProtos::relSizeOf
                           ((AssignedProtos *)
                            ((long)&((local_1b8.
                                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_assigned).
                                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar31),pPVar33);
        if (dVar35 < (auVar37._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar14) - 4503599627370496.0))
        goto LAB_0010685e;
      }
      lVar31 = lVar31 + 0x20;
      uVar34 = uVar34 + 1;
    } while( true );
  }
  for (pAVar27 = local_1b8.
                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                 ._M_impl.super__Vector_impl_data._M_start; pAVar27 != pAVar9; pAVar27 = pAVar27 + 1
      ) {
    sVar14 = AssignedProtos::volume(pAVar27);
    if ((byte)(options.nbColorsPerPal - options.hasTransparentPixels) < sVar14) {
      mappings.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = AssignedProtos::begin(pAVar27);
      poVar3 = (pAVar27->_assigned).
               super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while ((pointer)mappings.
                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != poVar3) {
        prVar19 = AssignedProtos::
                  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                               *)&mappings);
        std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::
        emplace_back<packing::ProtoPalAttrs>(&queue.c,prVar19);
        AssignedProtos::
        Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
        ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      *)&mappings);
      }
      std::
      vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
      ::clear(&pAVar27->_assigned);
    }
  }
  do {
    pPVar32 = queue.c.
              super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    pAVar9 = local_1b8.
             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (2 < options.verbosity) {
        for (pAVar27 = local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar27 != pAVar9;
            pAVar27 = pAVar27 + 1) {
          fwrite("{ ",2,1,_stderr);
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = AssignedProtos::begin(pAVar27);
          poVar3 = (pAVar27->_assigned).
                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while (pFVar8 = _stderr,
                (pointer)mappings.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish != poVar3) {
            prVar19 = AssignedProtos::
                      Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                   *)&mappings);
            fprintf(_stderr,"[%zu] ",prVar19->protoPalIndex);
            pPVar33 = (protoPalettes->
                      super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                      super__Vector_impl_data._M_start + prVar19->protoPalIndex;
            pvVar20 = ProtoPalette::begin(pPVar33);
            pvVar21 = ProtoPalette::end(pPVar33);
            for (; pvVar20 != pvVar21; pvVar20 = pvVar20 + 1) {
              fprintf(_stderr,"%04x, ",(ulong)*pvVar20);
            }
            AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)&mappings);
          }
          sVar14 = AssignedProtos::volume(pAVar27);
          fprintf(pFVar8,"} (volume = %zu)\n",sVar14);
        }
      }
      Options::verbosePrint
                (&options,'\x04',"%zu palettes before decanting\n",
                 (long)local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      lVar31 = (long)local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      while (lVar31 = lVar31 + -1, lVar31 != 0) {
        for (lVar29 = 0;
            pAVar9 = local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start, lVar29 != lVar31;
            lVar29 = lVar29 + 1) {
          pAVar28 = local_1b8.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar31;
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = AssignedProtos::begin(pAVar28);
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_ =
               (pAVar28->_assigned).
               super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pAVar28;
          sVar22 = AssignedProtos::
                   combinedVolume<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
                             (pAVar9 + lVar29,
                              (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                               *)&mappings,
                              (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                               *)&processed,protoPalettes);
          if (sVar22 <= (byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
            mappings.
            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._0_16_ = AssignedProtos::begin(pAVar28);
            poVar3 = (pAVar28->_assigned).
                     super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            while ((pointer)mappings.
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != poVar3) {
              prVar19 = AssignedProtos::
                        Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                        ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                     *)&mappings);
              AssignedProtos::assign<unsigned_long_const&>(pAVar9 + lVar29,&prVar19->protoPalIndex);
              AssignedProtos::
              Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
              ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                            *)&mappings);
            }
            std::
            vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
            ::clear(&pAVar28->_assigned);
          }
        }
        bVar12 = AssignedProtos::empty
                           (local_1b8.
                            super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar31);
        if (bVar12) {
          std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::erase
                    (&local_1b8,
                     local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar31);
        }
      }
      Options::verbosePrint
                (&options,'\x04',"%zu palettes after decanting on palettes\n",
                 (long)local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_b0 = (pointer)((long)local_1b8.
                                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1b8.
                                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
      do {
        local_b0 = (pointer)&local_b0[-1].super__Optional_base<packing::ProtoPalAttrs,_false,_false>
                             ._M_payload.
                             super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                             super__Optional_payload_base<packing::ProtoPalAttrs>.field_0x37;
        if (local_b0 == (pointer)0x0) {
          Options::verbosePrint
                    (&options,'\x04',"%zu palettes after decanting on \"components\"\n",
                     (long)local_1b8.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1b8.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
          lVar31 = (long)local_1b8.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1b8.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          while (lVar31 = lVar31 + -1, lVar31 != 0) {
            for (lVar29 = 0;
                pAVar9 = local_1b8.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start, lVar29 != lVar31;
                lVar29 = lVar29 + 1) {
              pAVar28 = local_1b8.
                        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar31;
              mappings.
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._0_16_ = AssignedProtos::begin(pAVar28);
              while ((pointer)mappings.
                              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish !=
                     (pAVar28->_assigned).
                     super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
                prVar19 = AssignedProtos::
                          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                       *)&mappings);
                bVar12 = AssignedProtos::canFit
                                   (pAVar9 + lVar29,
                                    (protoPalettes->
                                    super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    prVar19->protoPalIndex);
                if (bVar12) {
                  prVar19 = AssignedProtos::
                            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                            ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                         *)&mappings);
                  AssignedProtos::assign<packing::ProtoPalAttrs>(pAVar9 + lVar29,prVar19);
                  std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
                            ((_Optional_payload_base<packing::ProtoPalAttrs> *)
                             mappings.
                             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                AssignedProtos::
                Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                              *)&mappings);
              }
            }
            bVar12 = AssignedProtos::empty
                               (local_1b8.
                                super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar31);
            if (bVar12) {
              std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::erase
                        (&local_1b8,
                         local_1b8.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar31);
            }
          }
          Options::verbosePrint
                    (&options,'\x04',"%zu palettes after decanting on proto-palettes\n",
                     (long)local_1b8.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1b8.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
          pAVar9 = local_1b8.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (2 < options.verbosity) {
            for (pAVar27 = local_1b8.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_start; pAVar27 != pAVar9;
                pAVar27 = pAVar27 + 1) {
              fwrite("{ ",2,1,_stderr);
              mappings.
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._0_16_ = AssignedProtos::begin(pAVar27);
              poVar3 = (pAVar27->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              while (pFVar8 = _stderr,
                    (pointer)mappings.
                             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish != poVar3) {
                prVar19 = AssignedProtos::
                          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                       *)&mappings);
                fprintf(_stderr,"[%zu] ",prVar19->protoPalIndex);
                pPVar33 = (protoPalettes->
                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                          super__Vector_impl_data._M_start + prVar19->protoPalIndex;
                pvVar20 = ProtoPalette::begin(pPVar33);
                pvVar21 = ProtoPalette::end(pPVar33);
                for (; pvVar20 != pvVar21; pvVar20 = pvVar20 + 1) {
                  fprintf(_stderr,"%04x, ",(ulong)*pvVar20);
                }
                AssignedProtos::
                Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                              *)&mappings);
              }
              sVar14 = AssignedProtos::volume(pAVar27);
              fprintf(pFVar8,"} (volume = %zu)\n",sVar14);
            }
          }
          std::
          vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::vector(&mappings,
                   (long)(protoPalettes->
                         super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(protoPalettes->
                         super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3,(allocator_type *)&processed);
          for (uVar15 = 0;
              uVar34 = (long)local_1b8.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1b8.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5, uVar15 < uVar34;
              uVar15 = uVar15 + 1) {
            pAVar28 = local_1b8.
                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15;
            processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base = (_Bit_iterator_base)AssignedProtos::begin(pAVar28);
            poVar3 = (pAVar28->_assigned).
                     super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            while ((pointer)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ !=
                   poVar3) {
              prVar19 = AssignedProtos::
                        Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                        ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                     *)&processed);
              mappings.
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[prVar19->protoPalIndex] = uVar15;
              AssignedProtos::
              Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
              ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                            *)&processed);
            }
          }
          (__return_storage_ptr__->
          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
          ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
          _M_head_impl = uVar34;
          std::
          vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::vector(&(__return_storage_ptr__->
                    super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ).
                    super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                    ._M_head_impl,&mappings);
          std::
          _Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~_Vector_base(&mappings.
                           super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         );
          std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::~vector
                    (&local_1b8);
          std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque
                    (&queue.c);
          std::
          _Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~_Vector_base(&sortedProtoPalIDs.
                           super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         );
          return __return_storage_ptr__;
        }
        for (puVar26 = (undefined1 *)0x0;
            pAVar9 = local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start, (pointer)puVar26 != local_b0;
            puVar26 = puVar26 + 1) {
          pAVar28 = local_1b8.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)local_b0;
          sVar14 = AssignedProtos::nbProtoPals(pAVar28);
          auVar6[0xf] = 0;
          auVar6._0_15_ =
               (undefined1  [15])
               mappings.
               super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._1_15_;
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = auVar6 << 8;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&processed,sVar14,(bool *)&mappings,(allocator_type *)&members);
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)apPStack_e8;
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          apPStack_e8[0] = (_Elt_pointer)0x0;
          members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while( true ) {
            attrs_1._array._0_1_ = 1;
            _Var38 = std::
                     __find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                               (processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                                processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                                processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset,&attrs_1);
            puVar23 = _Var38.super__Bit_iterator_base._M_p;
            uVar15 = (ulong)_Var38.super__Bit_iterator_base._M_offset;
            if ((puVar23 ==
                 processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
               (_Var38.super__Bit_iterator_base._M_offset ==
                processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) break;
            attrs_1 = AssignedProtos::begin(pAVar28);
            std::
            __advance<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>,long>
                      (&attrs_1);
            std::
            _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&mappings);
            if (members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_start;
            }
            do {
              prVar19 = AssignedProtos::
                        Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                        ::operator*(&attrs_1);
              __first1 = mappings.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pPVar33 = (protoPalettes->
                        super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                        super__Vector_impl_data._M_start + prVar19->protoPalIndex;
              iVar1 = (int)uVar15;
              if (members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_00107460:
                pvVar20 = ProtoPalette::begin(pPVar33);
                pvVar21 = ProtoPalette::end(pPVar33);
                std::__detail::
                _Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::insert<unsigned_short_const*>
                          ((_Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&mappings,pvVar20,pvVar21);
                efficiency.bestPal =
                     (value_type *)
                     (uVar15 + ((long)puVar23 -
                               (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               ) * 8);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&members,(unsigned_long *)&efficiency);
                *puVar23 = *puVar23 | 1L << ((byte)uVar15 & 0x3f);
              }
              else {
                pvVar20 = ProtoPalette::begin(pPVar33);
                pvVar21 = ProtoPalette::end(pPVar33);
                _Var24 = std::
                         find_first_of<std::__detail::_Node_iterator<unsigned_short,true,false>,unsigned_short_const*>
                                   ((_Node_iterator<unsigned_short,_true,_false>)__first1,
                                    (_Node_iterator<unsigned_short,_true,_false>)0x0,pvVar20,pvVar21
                                   );
                if (_Var24.super__Node_iterator_base<unsigned_short,_false>._M_cur !=
                    (__node_type *)0x0) goto LAB_00107460;
              }
              puVar23 = puVar23 + (iVar1 == 0x3f);
              uVar5 = iVar1 + 1;
              if (iVar1 == 0x3f) {
                uVar5 = 0;
              }
              uVar15 = (ulong)uVar5;
              AssignedProtos::
              Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
              ::operator++(&attrs_1);
            } while ((puVar23 !=
                      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
                    (uVar5 != processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)
                    );
            efficiency.bestPal =
                 (value_type *)
                 mappings.
                 super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_88.super__Node_iterator_base<unsigned_short,_false>._M_cur =
                 (_Node_iterator_base<unsigned_short,_false>)(__node_type *)0x0;
            sVar22 = AssignedProtos::
                     combinedVolume<std::__detail::_Node_iterator<unsigned_short,true,false>>
                               (pAVar9 + (long)puVar26,
                                (_Node_iterator<unsigned_short,_true,_false> *)&efficiency,&local_88
                               );
            if (sVar22 <= (byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
              _efficiency = AssignedProtos::begin(pAVar28);
              puVar10 = members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              uVar25 = 0;
              for (puVar30 = members.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar30 != puVar10;
                  puVar30 = puVar30 + 1) {
                uVar4 = *puVar30;
                std::
                __advance<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>,long>
                          ((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                            *)&efficiency,uVar4 - uVar25);
                prVar19 = AssignedProtos::
                          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                       *)&efficiency);
                AssignedProtos::assign<packing::ProtoPalAttrs>(pAVar9 + (long)puVar26,prVar19);
                std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
                          ((_Optional_payload_base<packing::ProtoPalAttrs> *)local_b8._M_current);
                uVar25 = uVar4;
              }
            }
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::
          _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&mappings);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&processed.super__Bvector_base<std::allocator<bool>_>);
        }
        bVar12 = AssignedProtos::empty
                           (local_1b8.
                            super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)local_b0);
        if (bVar12) {
          std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::erase
                    (&local_1b8,
                     local_1b8.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)local_b0);
        }
      } while( true );
    }
    pPVar33 = (protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
              _M_impl.super__Vector_impl_data._M_start +
              (queue.c.
               super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur)->protoPalIndex;
    lVar29 = (long)local_1b8.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1b8.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pAVar27 = local_1b8.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (lVar31 = lVar29 >> 7; pAVar28 = pAVar27, 0 < lVar31; lVar31 = lVar31 + -1) {
      bVar12 = AssignedProtos::canFit(pAVar27,pPVar33);
      if (bVar12) goto LAB_00106f28;
      bVar12 = AssignedProtos::canFit(pAVar27 + 1,pPVar33);
      pAVar28 = pAVar27 + 1;
      if (bVar12) goto LAB_00106f28;
      bVar12 = AssignedProtos::canFit(pAVar27 + 2,pPVar33);
      pAVar28 = pAVar27 + 2;
      if (bVar12) goto LAB_00106f28;
      bVar12 = AssignedProtos::canFit(pAVar27 + 3,pPVar33);
      pAVar28 = pAVar27 + 3;
      if (bVar12) goto LAB_00106f28;
      pAVar27 = pAVar27 + 4;
      lVar29 = lVar29 + -0x80;
    }
    lVar29 = lVar29 >> 5;
    if (lVar29 == 1) {
LAB_00106f12:
      bVar12 = AssignedProtos::canFit(pAVar27,pPVar33);
      pAVar28 = pAVar9;
      if (bVar12) {
        pAVar28 = pAVar27;
      }
    }
    else if (lVar29 == 2) {
LAB_00106ef3:
      bVar12 = AssignedProtos::canFit(pAVar28,pPVar33);
      if (!bVar12) {
        pAVar27 = pAVar28 + 1;
        goto LAB_00106f12;
      }
    }
    else {
      pAVar28 = pAVar9;
      if ((lVar29 == 3) &&
         (bVar12 = AssignedProtos::canFit(pAVar27,pPVar33), pAVar28 = pAVar27, !bVar12)) {
        pAVar28 = pAVar27 + 1;
        goto LAB_00106ef3;
      }
    }
LAB_00106f28:
    if (pAVar28 ==
        local_1b8.
        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Options::verbosePrint
                (&options,'\x04',"Adding new palette (%zu) for overflowing proto-pal %zu\n",
                 (long)pAVar28 -
                 (long)local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,pPVar32->protoPalIndex);
      std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
      emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                 &local_1b8,protoPalettes,pPVar32);
    }
    else {
      Options::verbosePrint
                (&options,'\x04',"Assigning overflowing proto-pal %zu to palette %zu\n",
                 pPVar32->protoPalIndex,
                 (long)pAVar28 -
                 (long)local_1b8.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      AssignedProtos::assign<packing::ProtoPalAttrs_const>(pAVar28,pPVar32);
    }
    std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::pop_front(&queue.c)
    ;
  } while( true );
LAB_00106973:
  sVar14 = AssignedProtos::volume(pAVar28);
  if (sVar14 <= (byte)(options.nbColorsPerPal - options.hasTransparentPixels)) goto LAB_00106942;
  sVar14 = AssignedProtos::volume(pAVar28);
  Options::verbosePrint
            (&options,'\x04',"Palette %zu is overloaded! (%zu > %u)\n",local_148,sVar14,
             (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels));
  efficiency.bestPal = pAVar28;
  __it2 = (_Bit_iterator_base)AssignedProtos::begin(pAVar28);
  local_138._M_current = __it2._8_8_;
  poVar2 = (pAVar28->_assigned).
           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  attrs_1._iter._M_current = (optional<packing::ProtoPalAttrs> *)protoPalettes;
  attrs_1._array = (remove_const_t<decltype(_assigned)> *)&efficiency;
  processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = __it2._M_p;
  members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_138._M_current;
  processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base = __it2;
  if ((local_138._M_current != poVar2) &&
     (pIVar17 = AssignedProtos::
                Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                              *)&members), (pIVar17->_iter)._M_current != poVar2)) {
    __it1._iter._M_current =
         (optional<packing::ProtoPalAttrs> *)
         members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    __it1._array = (remove_const_t<decltype(_assigned)> *)
                   members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_start;
    bVar12 = __gnu_cxx::__ops::
             _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
             ::operator()(&attrs_1,__it1,
                          (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                           )__it2);
    _Var11._8_8_ = members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_finish;
    _Var11._M_p = members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (!bVar12) {
      pvVar18 = (vector<bool,_std::allocator<bool>_> *)&members;
      local_138._M_current =
           (optional<packing::ProtoPalAttrs> *)
           members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      goto LAB_00106aa7;
    }
LAB_00106aa2:
    __it2 = _Var11;
    pvVar18 = &processed;
LAB_00106aa7:
    do {
      local_1c8 = (remove_const_t<decltype(_assigned)> *)
                  (pvVar18->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
LAB_00106ab7:
      do {
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ =
             members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        AssignedProtos::
        Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
        ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      *)&processed);
        _Var11 = __it2;
        if ((optional<packing::ProtoPalAttrs> *)
            processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._8_8_ == poVar2) {
LAB_00106c8c:
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = _Var11;
          mappings.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8;
          goto LAB_00106cbe;
        }
        members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
        members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
        pIVar17 = AssignedProtos::
                  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                *)&members);
        if ((pIVar17->_iter)._M_current == poVar2) {
          bVar12 = __gnu_cxx::__ops::
                   _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                   ::operator()(&attrs_1,(Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                          )processed.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base,
                                (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                 )__it2);
          _Var11 = processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start;
          if ((!bVar12) &&
             (__it2_02._iter._M_current = local_138._M_current, __it2_02._array = local_1c8,
             bVar12 = __gnu_cxx::__ops::
                      _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                      ::operator()(&attrs_1,(Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                             )processed.super__Bvector_base<std::allocator<bool>_>.
                                              _M_impl.super__Bvector_impl_data._M_start.
                                              super__Bit_iterator_base,__it2_02), _Var11 = __it2,
             !bVar12)) {
            local_1c8 = (remove_const_t<decltype(_assigned)> *)
                        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          }
          goto LAB_00106c8c;
        }
        __it1_00._iter._M_current =
             (optional<packing::ProtoPalAttrs> *)
             members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        __it1_00._array =
             (remove_const_t<decltype(_assigned)> *)
             members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        bVar12 = __gnu_cxx::__ops::
                 _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                 ::operator()(&attrs_1,__it1_00,
                              (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                               )processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base);
        if (bVar12) {
          __it1_01._iter._M_current =
               (optional<packing::ProtoPalAttrs> *)
               members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          __it1_01._array =
               (remove_const_t<decltype(_assigned)> *)
               members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          bVar12 = __gnu_cxx::__ops::
                   _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                   ::operator()(&attrs_1,__it1_01,
                                (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                 )__it2);
          _Var7._8_8_ = members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          _Var7._M_p = members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          __it2_00._iter._M_current = local_138._M_current;
          __it2_00._array = local_1c8;
          bVar13 = __gnu_cxx::__ops::
                   _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                   ::operator()(&attrs_1,(Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                          )processed.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base,__it2_00);
          if (!bVar12) {
            _Var7 = __it2;
          }
          __it2 = _Var7;
          if (!bVar13) {
            local_138._M_current =
                 (optional<packing::ProtoPalAttrs> *)
                 processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
            _Var11 = __it2;
            goto LAB_00106aa2;
          }
          goto LAB_00106ab7;
        }
        bVar12 = __gnu_cxx::__ops::
                 _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                 ::operator()(&attrs_1,(Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                        )processed.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base,
                              (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                               )__it2);
        _Var11 = processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base;
        __it1_02._iter._M_current =
             (optional<packing::ProtoPalAttrs> *)
             members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        __it1_02._array =
             (remove_const_t<decltype(_assigned)> *)
             members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        __it2_01._iter._M_current = local_138._M_current;
        __it2_01._array = local_1c8;
        bVar13 = __gnu_cxx::__ops::
                 _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                 ::operator()(&attrs_1,__it1_02,__it2_01);
        if (!bVar12) {
          _Var11 = __it2;
        }
        __it2 = _Var11;
      } while (bVar13);
      local_138._M_current =
           (optional<packing::ProtoPalAttrs> *)
           members.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar18 = (vector<bool,_std::allocator<bool>_> *)&members;
    } while( true );
  }
  mappings.
  super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ =
       processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base;
  mappings.
  super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
LAB_00106cbe:
  prVar19 = AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                         *)&mappings.
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dVar35 = overloadAndRemove::anon_class_8_1_7660daf7::operator()
                     (&efficiency,
                      (protoPalettes->
                      super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                      super__Vector_impl_data._M_start + prVar19->protoPalIndex);
  prVar19 = AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                         *)&mappings);
  dVar36 = overloadAndRemove::anon_class_8_1_7660daf7::operator()
                     (&efficiency,
                      (protoPalettes->
                      super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
                      super__Vector_impl_data._M_start + prVar19->protoPalIndex);
  if (dVar35 - dVar36 < 0.001) goto LAB_00106942;
  prVar19 = AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                         *)&mappings);
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::
  emplace_back<packing::ProtoPalAttrs>(&queue.c,prVar19);
  pPVar32 = queue.c.
            super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pPVar32 = queue.c.
              super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  ProtoPalAttrs::banFrom(pPVar32 + -1,local_148);
  std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
            ((_Optional_payload_base<packing::ProtoPalAttrs> *)
             mappings.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  goto LAB_00106973;
LAB_00106942:
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::pop_front(&queue.c);
  goto LAB_001067c9;
}

Assistant:

std::tuple<DefaultInitVec<size_t>, size_t>
    overloadAndRemove(std::vector<ProtoPalette> const &protoPalettes) {
	options.verbosePrint(Options::VERB_LOG_ACT,
	                     "Paginating palettes using \"overload-and-remove\" strategy...\n");

	// Sort the proto-palettes by size, which improves the packing algorithm's efficiency
	DefaultInitVec<size_t> sortedProtoPalIDs(protoPalettes.size());
	sortedProtoPalIDs.clear();
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		sortedProtoPalIDs.insert(
		    std::lower_bound(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end(), i), i);
	}
	// Begin with all proto-palettes queued up for insertion
	std::queue<ProtoPalAttrs> queue(
	    std::deque<ProtoPalAttrs>(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end()));
	// Begin with no pages
	std::vector<AssignedProtos> assignments{};

	for (; !queue.empty(); queue.pop()) {
		ProtoPalAttrs const &attrs = queue.front(); // Valid until the `queue.pop()`
		options.verbosePrint(Options::VERB_DEBUG, "Handling proto-pal %zu\n", attrs.protoPalIndex);

		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		size_t bestPalIndex = assignments.size();
		// We're looking for a palette where the proto-palette's relative size is less than
		// its actual size; so only overwrite the "not found" index on meeting that criterion
		double bestRelSize = protoPal.size();

		for (size_t i = 0; i < assignments.size(); ++i) {
			// Skip the page if this one is banned from it
			if (attrs.isBannedFrom(i)) {
				continue;
			}

			options.verbosePrint(Options::VERB_DEBUG, "%zu/%zu: Rel size: %f (size = %zu)\n", i + 1,
			                     assignments.size(), assignments[i].relSizeOf(protoPal),
			                     protoPal.size());
			if (assignments[i].relSizeOf(protoPal) < bestRelSize) {
				bestPalIndex = i;
			}
		}

		if (bestPalIndex == assignments.size()) {
			// Found nowhere to put it, create a new page containing just that one
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			auto &bestPal = assignments[bestPalIndex];
			// Add the color to that palette
			bestPal.assign(std::move(attrs));

			// If this overloads the palette, get it back to normal (if possible)
			while (bestPal.volume() > options.maxOpaqueColors()) {
				options.verbosePrint(Options::VERB_DEBUG,
				                     "Palette %zu is overloaded! (%zu > %" PRIu8 ")\n",
				                     bestPalIndex, bestPal.volume(), options.maxOpaqueColors());

				// Look for a proto-pal minimizing "efficiency" (size / rel_size)
				auto efficiency = [&bestPal](ProtoPalette const &pal) {
					return pal.size() / bestPal.relSizeOf(pal);
				};
				auto [minEfficiencyIter, maxEfficiencyIter] =
				    std::minmax_element(bestPal.begin(), bestPal.end(),
				                        [&efficiency, &protoPalettes](ProtoPalAttrs const &lhs,
				                                                      ProtoPalAttrs const &rhs) {
					                        return efficiency(protoPalettes[lhs.protoPalIndex])
					                               < efficiency(protoPalettes[rhs.protoPalIndex]);
				                        });

				// All efficiencies are identical iff min equals max
				// TODO: maybe not ideal to re-compute these two?
				// TODO: yikes for float comparison! I *think* this threshold is OK?
				if (efficiency(protoPalettes[maxEfficiencyIter->protoPalIndex])
				        - efficiency(protoPalettes[minEfficiencyIter->protoPalIndex])
				    < .001) {
					break;
				}

				// Remove the proto-pal with minimal efficiency
				queue.emplace(std::move(*minEfficiencyIter));
				queue.back().banFrom(bestPalIndex); // Ban it from this palette
				bestPal.remove(minEfficiencyIter);
			}
		}
	}

	// Deal with palettes still overloaded, by emptying them
	for (AssignedProtos &pal : assignments) {
		if (pal.volume() > options.maxOpaqueColors()) {
			for (ProtoPalAttrs &attrs : pal) {
				queue.emplace(std::move(attrs));
			}
			pal.clear();
		}
	}
	// Place back any proto-palettes now in the queue via first-fit
	while (!queue.empty()) {
		ProtoPalAttrs const &attrs = queue.front();
		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		auto iter =
		    std::find_if(assignments.begin(), assignments.end(),
		                 [&protoPal](AssignedProtos const &pal) { return pal.canFit(protoPal); });
		if (iter == assignments.end()) { // No such page, create a new one
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Adding new palette (%zu) for overflowing proto-pal %zu\n",
			                     assignments.size(), attrs.protoPalIndex);
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Assigning overflowing proto-pal %zu to palette %zu\n",
			                     attrs.protoPalIndex, iter - assignments.begin());
			iter->assign(std::move(attrs));
		}
		queue.pop();
	}

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	// "Decant" the result
	decant(assignments, protoPalettes);
	// Note that the result does not contain any empty palettes

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	DefaultInitVec<size_t> mappings(protoPalettes.size());
	for (size_t i = 0; i < assignments.size(); ++i) {
		for (ProtoPalAttrs const &attrs : assignments[i]) {
			mappings[attrs.protoPalIndex] = i;
		}
	}
	return {mappings, assignments.size()};
}